

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

trie_node trie_node_insert(trie t,trie_node parent,trie_key key,trie_value value)

{
  trie_node_free_conflict __ptr;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *__ptr_00;
  set psVar4;
  trie_node ptVar5;
  size_t sVar6;
  undefined8 uVar7;
  char *pcVar8;
  
  if (key == (trie_key)0x0) {
    pcVar8 = "Trie invalid node insertion parameters";
    uVar7 = 0xe3;
LAB_00104202:
    log_write_impl_va("metacall",uVar7,"trie_node_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                      ,3,pcVar8);
    return (trie_node)0x0;
  }
  __ptr_00 = (undefined8 *)malloc(0x10);
  if (__ptr_00 == (undefined8 *)0x0) {
    pcVar8 = "Trie node insert bad reference node allocation";
    uVar7 = 0xec;
    goto LAB_00104202;
  }
  *__ptr_00 = key;
  if (parent->childs == (set)0x0) {
    psVar4 = set_create(t->hash_cb,t->compare_cb);
    parent->childs = psVar4;
    if (psVar4 == (set)0x0) {
      pcVar8 = "Trie invalid child set allocation";
      uVar7 = 0xf9;
      goto LAB_00104356;
    }
  }
  __ptr = t->free_node_list;
  if (__ptr == (trie_node_free_conflict)0x0) {
    uVar1 = t->capacity;
    if (uVar1 <= t->size + 1) {
      ptVar5 = (trie_node)realloc(t->node_list,uVar1 * 0x50);
      if (ptVar5 == (trie_node)0x0) {
        log_write_impl_va("metacall",0x11d,"trie_node_insert",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                          ,3,"Trie bad node list reallocation");
        free(__ptr_00);
      }
      else {
        uVar1 = uVar1 * 2;
        t->node_list = ptVar5;
        t->capacity = uVar1;
        t->root = ptVar5;
        uVar2 = t->size;
        if (uVar2 + 1 < uVar1) {
          memset(ptVar5 + uVar2 + 1,0,(uVar1 + ~uVar2) * 0x28);
        }
      }
      if (ptVar5 == (trie_node)0x0) {
        return (trie_node)0x0;
      }
    }
    sVar6 = t->size;
    __ptr_00[1] = sVar6;
    ptVar5 = t->node_list + sVar6;
  }
  else {
    t->free_node_list = __ptr->next;
    sVar6 = __ptr->index;
    __ptr_00[1] = sVar6;
    ptVar5 = t->node_list + sVar6;
    free(__ptr);
    sVar6 = t->size;
  }
  t->size = sVar6 + 1;
  if (ptVar5 == (trie_node)0x0) {
    free(__ptr_00);
    return (trie_node)0x0;
  }
  iVar3 = set_insert(parent->childs,key,__ptr_00);
  if (iVar3 == 0) {
    ptVar5->parent_index = parent->self_index;
    ptVar5->self_index = __ptr_00[1];
    ptVar5->key = key;
    ptVar5->value = value;
    ptVar5->childs = (set)0x0;
    return ptVar5;
  }
  pcVar8 = "Trie invalid child insertion";
  uVar7 = 0x141;
LAB_00104356:
  log_write_impl_va("metacall",uVar7,"trie_node_insert",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                    ,3,pcVar8);
  free(__ptr_00);
  return (trie_node)0x0;
}

Assistant:

trie_node trie_node_insert(trie t, trie_node parent, trie_key key, trie_value value)
{
	trie_node child;
	trie_node_ref child_ref;

	if (t == NULL || parent == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid node insertion parameters");

		return NULL;
	}

	child_ref = malloc(sizeof(struct trie_node_ref_type));

	if (child_ref == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Trie node insert bad reference node allocation");

		return NULL;
	}

	child_ref->key = key;

	if (parent->childs == NULL)
	{
		parent->childs = set_create(t->hash_cb, t->compare_cb);

		if (parent->childs == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid child set allocation");

			free(child_ref);

			return NULL;
		}
	}

	if (t->free_node_list != NULL)
	{
		trie_node_free node_free = t->free_node_list;

		t->free_node_list = node_free->next;

		child_ref->index = node_free->index;

		child = &t->node_list[child_ref->index];

		free(node_free);

		++t->size;
	}
	else
	{
		if ((t->size + 1) >= t->capacity)
		{
			register void *node_list;

			size_t capacity = t->capacity << 1;

			size_t iterator;

			node_list = realloc(t->node_list, capacity * sizeof(struct trie_node_type));

			if (node_list == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Trie bad node list reallocation");

				free(child_ref);

				return NULL;
			}

			t->node_list = node_list;

			t->capacity = capacity;

			t->root = &t->node_list[0];

			for (iterator = t->size + 1; iterator < t->capacity; ++iterator)
			{
				trie_node n = &t->node_list[iterator];

				n->parent_index = 0;
				n->self_index = 0;
				n->key = NULL;
				n->value = NULL;
				n->childs = NULL;
			}
		}

		child_ref->index = t->size;

		child = &t->node_list[child_ref->index];

		++t->size;
	}

	if (child != NULL)
	{
		if (set_insert(parent->childs, key, child_ref) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid child insertion");

			free(child_ref);

			return NULL;
		}

		child->parent_index = parent->self_index;
		child->self_index = child_ref->index;
		child->key = key;
		child->value = value;
		child->childs = NULL;

		return child;
	}

	free(child_ref);

	return NULL;
}